

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_extensions_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::UpdateExtensionsStatement::ToString_abi_cxx11_
          (string *__return_storage_ptr__,UpdateExtensionsStatement *this)

{
  pointer pUVar1;
  unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
  *this_00;
  idx_t i;
  ulong __n;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = &this->info;
  pUVar1 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
           ::operator->(this_00);
  if ((pUVar1->extensions_to_update).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pUVar1->extensions_to_update).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    __n = 0;
    while( true ) {
      pUVar1 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
               ::operator->(this_00);
      if ((ulong)((long)(pUVar1->extensions_to_update).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pUVar1->extensions_to_update).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= __n) break;
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pUVar1 = unique_ptr<duckdb::UpdateExtensionsInfo,_std::default_delete<duckdb::UpdateExtensionsInfo>,_true>
               ::operator->(this_00);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::get<true>(&pUVar1->extensions_to_update,__n);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      __n = __n + 1;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string UpdateExtensionsStatement::ToString() const {
	string result;
	result += "UPDATE EXTENSIONS";

	if (!info->extensions_to_update.empty()) {
		result += "(";
		for (idx_t i = 0; i < info->extensions_to_update.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			result += info->extensions_to_update[i];
		}
		result += ")";
	}

	return result;
}